

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

void __thiscall MyAudioDescriptor::MyDump(MyAudioDescriptor *this,FILE *stream)

{
  bool bVar1;
  reference ppMVar2;
  iterator local_38;
  _List_const_iterator<ASDCP::MXF::MCALabelSubDescriptor_*> local_30;
  iterator local_28;
  _List_const_iterator<ASDCP::MXF::MCALabelSubDescriptor_*> local_20;
  const_iterator i;
  FILE *stream_local;
  MyAudioDescriptor *this_local;
  
  i._M_node = (_List_node_base *)stream;
  if (stream == (FILE *)0x0) {
    i._M_node = _stderr;
  }
  if (this->m_WaveAudioDescriptor != (WaveAudioDescriptor *)0x0) {
    (**(code **)(*(long *)this->m_WaveAudioDescriptor + 0x88))
              (this->m_WaveAudioDescriptor,i._M_node);
  }
  bVar1 = std::__cxx11::
          list<ASDCP::MXF::MCALabelSubDescriptor_*,_std::allocator<ASDCP::MXF::MCALabelSubDescriptor_*>_>
          ::empty(&this->m_ChannelDescriptorList);
  if (!bVar1) {
    fprintf((FILE *)i._M_node,"Audio Channel Subdescriptors:\n");
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<ASDCP::MXF::MCALabelSubDescriptor_*,_std::allocator<ASDCP::MXF::MCALabelSubDescriptor_*>_>
         ::begin(&this->m_ChannelDescriptorList);
    std::_List_const_iterator<ASDCP::MXF::MCALabelSubDescriptor_*>::_List_const_iterator
              (&local_20,&local_28);
    while( true ) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<ASDCP::MXF::MCALabelSubDescriptor_*,_std::allocator<ASDCP::MXF::MCALabelSubDescriptor_*>_>
           ::end(&this->m_ChannelDescriptorList);
      std::_List_const_iterator<ASDCP::MXF::MCALabelSubDescriptor_*>::_List_const_iterator
                (&local_30,&local_38);
      bVar1 = std::operator!=(&local_20,&local_30);
      if (!bVar1) break;
      ppMVar2 = std::_List_const_iterator<ASDCP::MXF::MCALabelSubDescriptor_*>::operator*(&local_20)
      ;
      (**(code **)(*(long *)*ppMVar2 + 0x88))(*ppMVar2,i._M_node);
      std::_List_const_iterator<ASDCP::MXF::MCALabelSubDescriptor_*>::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void MyDump(FILE* stream) {
    if ( stream == 0 )
      {
	stream = stderr;
      }

    if ( m_WaveAudioDescriptor != 0 )
      {
	m_WaveAudioDescriptor->Dump(stream);
      }

    if ( ! m_ChannelDescriptorList.empty() )
      {
	fprintf(stream, "Audio Channel Subdescriptors:\n");

	std::list<MCALabelSubDescriptor*>::const_iterator i = m_ChannelDescriptorList.begin();
	for ( ; i != m_ChannelDescriptorList.end(); ++i )
	  {
	    (**i).Dump(stream);
	  }
      }
  }